

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsetable.cpp
# Opt level: O1

void __thiscall ParseTable::operator()(ParseTable *this,Automaton *aut)

{
  StateList *pSVar1;
  debug_infot *pdVar2;
  _List_node_base *this_00;
  Grammar *pGVar3;
  int iVar4;
  QTextStream *pQVar5;
  set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
  *ns;
  const_iterator cVar6;
  _Rb_tree_node_base *p_Var7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  long lVar10;
  bool bVar11;
  _List_node_base *p_Var12;
  int iVar13;
  long in_FS_OFFSET;
  set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
  lookaheads;
  _List_iterator<Item> local_a0;
  _Rb_tree<std::_List_iterator<QString>,_std::_List_iterator<QString>,_std::_Identity<std::_List_iterator<QString>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
  local_98;
  undefined1 local_68 [8];
  _Rb_tree_node_base _Stack_60;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pGVar3 = aut->_M_grammar;
  pdVar2 = &pGVar3->rules;
  p_Var12 = (pGVar3->rules).super__List_base<Rule,_std::allocator<Rule>_>._M_impl._M_node.
            super__List_node_base._M_next;
  if (p_Var12 != (_List_node_base *)pdVar2) {
    iVar13 = 1;
    do {
      pQVar5 = (QTextStream *)QTextStream::operator<<(this->out,iVar13);
      pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,")\t");
      pQVar5 = operator<<(pQVar5,(Rule *)(p_Var12 + 1));
      Qt::endl(pQVar5);
      p_Var12 = p_Var12->_M_next;
      iVar13 = iVar13 + 1;
    } while (p_Var12 != (_List_node_base *)pdVar2);
  }
  pQVar5 = (QTextStream *)Qt::endl(this->out);
  Qt::endl(pQVar5);
  pSVar1 = &aut->states;
  p_Var12 = (aut->states).super__List_base<State,_std::allocator<State>_>._M_impl._M_node.
            super__List_node_base._M_next;
  if (p_Var12 != (_List_node_base *)pSVar1) {
    iVar13 = 0;
    do {
      pQVar5 = (QTextStream *)QTextStream::operator<<(this->out,"state ");
      pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,iVar13);
      pQVar5 = (QTextStream *)Qt::endl(pQVar5);
      Qt::endl(pQVar5);
      for (local_68 = (undefined1  [8])p_Var12[1]._M_next;
          local_68 != (undefined1  [8])(p_Var12 + 1);
          local_68 = (undefined1  [8])*(_List_node_base **)local_68) {
        pQVar5 = (QTextStream *)QTextStream::operator<<(this->out," *  ");
        operator<<(pQVar5,(Item *)((long)local_68 + 0x10));
        if (((_List_node_base *)((long)local_68 + 0x10))->_M_prev ==
            (_List_node_base *)&((_List_node_base *)((long)local_68 + 0x10))->_M_next[1]._M_prev) {
          pQVar5 = (QTextStream *)QTextStream::operator<<(this->out," ");
          ns = QMap<std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
               ::operator[](&aut->lookaheads,(_List_iterator<Item> *)local_68);
          operator<<(pQVar5,ns);
        }
        Qt::endl(this->out);
      }
      this_00 = p_Var12 + 4;
      QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::detach
                ((QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_> *)this_00);
      p_Var7 = (_Rb_tree_node_base *)p_Var12[4]._M_next[2]._M_next;
      QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::detach
                ((QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_> *)this_00);
      if (p_Var7 != (_Rb_tree_node_base *)(p_Var12[4]._M_next + 1)) {
        bVar11 = true;
        do {
          local_68 = *(undefined1 (*) [8])(p_Var7 + 1);
          cVar6 = std::
                  _Rb_tree<std::_List_iterator<QString>,_std::_List_iterator<QString>,_std::_Identity<std::_List_iterator<QString>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                  ::find(&(pGVar3->terminals)._M_t,(key_type *)local_68);
          if ((_Rb_tree_header *)cVar6._M_node !=
              &(pGVar3->terminals)._M_t._M_impl.super__Rb_tree_header) {
            if (bVar11) {
              Qt::endl(this->out);
            }
            pQVar5 = (QTextStream *)QTextStream::operator<<(this->out,"    ");
            pQVar5 = (QTextStream *)
                     QTextStream::operator<<(pQVar5,(QString *)(*(long *)(p_Var7 + 1) + 0x10));
            pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5," shift, and go to state ");
            lVar10 = 0;
            for (p_Var8 = (_Base_ptr)
                          (pSVar1->super__List_base<State,_std::allocator<State>_>)._M_impl._M_node.
                          super__List_node_base._M_next; p_Var8 != p_Var7[1]._M_parent;
                p_Var8 = *(_Base_ptr *)p_Var8) {
              lVar10 = lVar10 + 1;
            }
            pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,lVar10);
            Qt::endl(pQVar5);
            bVar11 = false;
          }
          p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
          QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::detach
                    ((QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_> *)this_00);
        } while ((_Rb_tree_header *)p_Var7 !=
                 &(((((QExplicitlySharedDataPointerV2<QMapData<std::map<std::_List_iterator<QString>,_std::_List_iterator<State>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<State>_>_>_>_>_>
                       *)&this_00->_M_next)->d).ptr)->m)._M_t._M_impl.super__Rb_tree_header);
      }
      local_a0._M_node = p_Var12[2]._M_prev;
      if (local_a0._M_node != (_List_node_base *)&p_Var12[2]._M_prev) {
        bVar11 = true;
        do {
          if ((local_a0._M_node[1]._M_prev ==
               (_List_node_base *)&local_a0._M_node[1]._M_next[1]._M_prev) &&
             (local_a0._M_node[1]._M_next != p_Var12[5]._M_prev)) {
            if (bVar11) {
              Qt::endl(this->out);
            }
            _Stack_60._M_right = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
            puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
            _Stack_60._M_parent = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
            _Stack_60._M_left = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
            local_68 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
            _Stack_60._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_98._M_impl._0_8_ = 0;
            local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_98._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
            local_98._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_98._M_impl.super__Rb_tree_header._M_header;
            local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_98._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_98._M_impl.super__Rb_tree_header._M_header._M_left;
            QMap<std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
            ::value((set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                     *)local_68,&aut->lookaheads,&local_a0,
                    (set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                     *)&local_98);
            std::
            _Rb_tree<std::_List_iterator<QString>,_std::_List_iterator<QString>,_std::_Identity<std::_List_iterator<QString>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
            ::_M_erase(&local_98,
                       (_Link_type)local_98._M_impl.super__Rb_tree_header._M_header._M_parent);
            p_Var8 = _Stack_60._M_left;
            if (_Stack_60._M_left != &_Stack_60) {
              do {
                pQVar5 = (QTextStream *)QTextStream::operator<<(this->out,"    ");
                pQVar5 = (QTextStream *)
                         QTextStream::operator<<(pQVar5,(QString *)(*(long *)(p_Var8 + 1) + 0x10));
                pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5," reduce using rule ");
                iVar4 = Automaton::id(aut,local_a0._M_node[1]._M_next);
                pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,iVar4);
                pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5," (");
                pQVar5 = (QTextStream *)
                         QTextStream::operator<<
                                   (pQVar5,(QString *)(local_a0._M_node[1]._M_next[1]._M_next + 1));
                pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,")");
                Qt::endl(pQVar5);
                p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
              } while (p_Var8 != &_Stack_60);
            }
            std::
            _Rb_tree<std::_List_iterator<QString>,_std::_List_iterator<QString>,_std::_Identity<std::_List_iterator<QString>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
            ::_M_erase((_Rb_tree<std::_List_iterator<QString>,_std::_List_iterator<QString>,_std::_Identity<std::_List_iterator<QString>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                        *)local_68,(_Link_type)_Stack_60._M_parent);
            bVar11 = false;
          }
          local_a0._M_node = (local_a0._M_node)->_M_next;
        } while (local_a0._M_node != (_List_node_base *)&p_Var12[2]._M_prev);
      }
      QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::detach
                ((QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_> *)this_00);
      p_Var8 = *(_Base_ptr *)
                ((long)&(((((QExplicitlySharedDataPointerV2<QMapData<std::map<std::_List_iterator<QString>,_std::_List_iterator<State>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<State>_>_>_>_>_>
                             *)&this_00->_M_next)->d).ptr)->m)._M_t._M_impl.super__Rb_tree_header.
                        _M_header + 0x10);
      QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::detach
                ((QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_> *)this_00);
      if ((_Rb_tree_header *)p_Var8 !=
          &(((((QExplicitlySharedDataPointerV2<QMapData<std::map<std::_List_iterator<QString>,_std::_List_iterator<State>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<State>_>_>_>_>_>
                *)&this_00->_M_next)->d).ptr)->m)._M_t._M_impl.super__Rb_tree_header) {
        bVar11 = true;
        do {
          local_68 = *(undefined1 (*) [8])(p_Var8 + 1);
          cVar6 = std::
                  _Rb_tree<std::_List_iterator<QString>,_std::_List_iterator<QString>,_std::_Identity<std::_List_iterator<QString>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                  ::find(&(pGVar3->non_terminals)._M_t,(key_type *)local_68);
          if ((_Rb_tree_header *)cVar6._M_node !=
              &(pGVar3->non_terminals)._M_t._M_impl.super__Rb_tree_header) {
            if (bVar11) {
              Qt::endl(this->out);
            }
            pQVar5 = (QTextStream *)QTextStream::operator<<(this->out,"    ");
            pQVar5 = (QTextStream *)
                     QTextStream::operator<<(pQVar5,(QString *)(*(long *)(p_Var8 + 1) + 0x10));
            pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5," go to state ");
            lVar10 = 0;
            for (p_Var9 = (_Base_ptr)
                          (pSVar1->super__List_base<State,_std::allocator<State>_>)._M_impl._M_node.
                          super__List_node_base._M_next; p_Var9 != p_Var8[1]._M_parent;
                p_Var9 = *(_Base_ptr *)p_Var9) {
              lVar10 = lVar10 + 1;
            }
            pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,lVar10);
            Qt::endl(pQVar5);
            bVar11 = false;
          }
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
          QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::detach
                    ((QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_> *)this_00);
        } while ((_Rb_tree_header *)p_Var8 !=
                 &(((((QExplicitlySharedDataPointerV2<QMapData<std::map<std::_List_iterator<QString>,_std::_List_iterator<State>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<State>_>_>_>_>_>
                       *)&this_00->_M_next)->d).ptr)->m)._M_t._M_impl.super__Rb_tree_header);
      }
      if (p_Var12[5]._M_prev != (_List_node_base *)pdVar2) {
        pQVar5 = (QTextStream *)Qt::endl(this->out);
        pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,"    $default reduce using rule ");
        iVar4 = Automaton::id(aut,p_Var12[5]._M_prev);
        pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,iVar4);
        pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5," (");
        pQVar5 = (QTextStream *)
                 QTextStream::operator<<(pQVar5,(QString *)(p_Var12[5]._M_prev[1]._M_next + 1));
        pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,")");
        Qt::endl(pQVar5);
      }
      iVar13 = iVar13 + 1;
      Qt::endl(this->out);
      p_Var12 = p_Var12->_M_next;
    } while (p_Var12 != (_List_node_base *)pSVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ParseTable::operator () (Automaton *aut)
{
  Grammar *g = aut->_M_grammar;

  int rindex = 1;
  for (RulePointer rule = g->rules.begin (); rule != g->rules.end (); ++rule)
    out << rindex++ << ")\t" << *rule << Qt::endl;
  out << Qt::endl << Qt::endl;

  int index = 0;
  for (StatePointer state = aut->states.begin (); state != aut->states.end (); ++state)
    {
      out << "state " << index++ << Qt::endl << Qt::endl;

      for (ItemPointer item = state->kernel.begin (); item != state->kernel.end (); ++item)
        {
          out << " *  " << *item;

          if (item->dot == item->end_rhs ())
            out << " " << aut->lookaheads [item];

          out << Qt::endl;
        }

      bool first = true;
      for (Bundle::iterator arrow = state->bundle.begin (); arrow != state->bundle.end (); ++arrow)
        {
          if (! g->isTerminal (arrow.key ()))
            continue;

          if (first)
            out << Qt::endl;

          first = false;

          out << "    " << *arrow.key () << " shift, and go to state " << std::distance (aut->states.begin (), *arrow) << Qt::endl;
        }

      first = true;
      for (ItemPointer item = state->closure.begin (); item != state->closure.end (); ++item)
        {
          if (item->dot != item->end_rhs () || item->rule == state->defaultReduce)
            continue;

          if (first)
            out << Qt::endl;

          first = false;

          const auto lookaheads = aut->lookaheads.value(item);
          for (const Name &la : lookaheads)
            out << "    " << *la << " reduce using rule " << aut->id (item->rule) << " (" << *item->rule->lhs << ")" << Qt::endl;
        }

      first = true;
      for (Bundle::iterator arrow = state->bundle.begin (); arrow != state->bundle.end (); ++arrow)
        {
          if (! g->isNonTerminal (arrow.key ()))
            continue;

          if (first)
            out << Qt::endl;

          first = false;

          out << "    " << *arrow.key () << " go to state " << std::distance (aut->states.begin (), *arrow) << Qt::endl;
        }

      if (state->defaultReduce != g->rules.end ())
        {
          out << Qt::endl
              << "    $default reduce using rule " << aut->id (state->defaultReduce) << " (" << *state->defaultReduce->lhs << ")" << Qt::endl;
        }

      out << Qt::endl;
    }
}